

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::writeEmptyPacketWithPCR(TSMuxer *this,int64_t pcrVal)

{
  pointer puVar1;
  TSPacket *this_00;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  AdaptiveField *this_01;
  
  iVar4 = this->m_outBufLen;
  if (this->m_m2tsMode == true) {
    iVar4 = iVar4 + 4;
    this->m_outBufLen = iVar4;
    this->m_processedBlockSize = this->m_processedBlockSize + 4;
    this->m_pcrBits = this->m_pcrBits + 0x20;
  }
  this_00 = (TSPacket *)(this->m_outBuf + iVar4);
  puVar2 = (uint *)(this->m_outBuf + iVar4);
  this_01 = (AdaptiveField *)(puVar2 + 1);
  puVar2[0] = 0x47;
  puVar2[1] = 0x1007;
  uVar3 = (this->m_pmt).pcr_pid;
  *puVar2 = (uVar3 & 0x1f00) + (uVar3 & 0xff) * 0x10000 + 0x20000047;
  AdaptiveField::setPCR33(this_01,pcrVal);
  pmVar6 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](&this->m_streamInfo,&(this->m_pmt).pcr_pid);
  *puVar2 = *puVar2 & 0xf0ffffff | (pmVar6->m_tsCnt & 0xfU) << 0x18;
  iVar4 = TSPacket::getHeaderSize(this_00);
  iVar5 = TSPacket::getHeaderSize(this_00);
  memset(&this_00->field_0x0 + iVar4,0xff,(long)(0xbc - iVar5));
  iVar4 = TSPacket::getHeaderSize(this_00);
  *(char *)this_01 = (SUB41(*this_01,0) - (char)iVar4) + -0x44;
  this->m_outBufLen = this->m_outBufLen + 0xbc;
  this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
  this->m_pcrBits = this->m_pcrBits + 0x5e0;
  puVar1 = (this->m_muxedPacketCnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  *puVar1 = *puVar1 + 1;
  if (this->m_m2tsMode == true) {
    processM2TSPCR(this,pcrVal,0);
  }
  writeOutBuffer(this);
  return;
}

Assistant:

void TSMuxer::writeEmptyPacketWithPCR(const int64_t pcrVal)
{
    if (m_m2tsMode)
    {
        m_outBufLen += 4;
        m_processedBlockSize += 4;
        m_pcrBits += 4 * 8;
    }
    uint8_t* curBuf = m_outBuf + m_outBufLen;
    const auto tsPacket = reinterpret_cast<TSPacket*>(curBuf);
    const auto initTS = reinterpret_cast<uint32_t*>(curBuf);
    *initTS = TSPacket::TS_FRAME_SYNC_BYTE;
    initTS[1] = 0x07 + TSPacket::PCR_BIT_VAL;
    tsPacket->setPID(m_pmt.pcr_pid);
    tsPacket->afExists = 1;
    tsPacket->adaptiveField.setPCR33(pcrVal);
    tsPacket->counter = m_streamInfo[m_pmt.pcr_pid].m_tsCnt;  // do not increment counter becouse data_exists == 0

    memset(curBuf + tsPacket->getHeaderSize(), 0xff, TS_FRAME_SIZE - tsPacket->getHeaderSize());
    tsPacket->adaptiveField.length += TS_FRAME_SIZE - tsPacket->getHeaderSize();
    m_outBufLen += TS_FRAME_SIZE;
    m_processedBlockSize += TS_FRAME_SIZE;
    m_pcrBits += TS_FRAME_SIZE * 8;
    m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
    if (m_m2tsMode)
        processM2TSPCR(pcrVal, 0);
    writeOutBuffer();
}